

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Image(ImTextureID user_texture_id,ImVec2 *size,ImVec2 *uv0,ImVec2 *uv1,ImVec4 *tint_col,
                 ImVec4 *border_col)

{
  bool bVar1;
  ImTextureID in_RCX;
  ImVec2 *in_RDX;
  ImVec2 *in_RDI;
  long in_R9;
  ImRect bb;
  ImGuiWindow *window;
  undefined4 in_stack_fffffffffffffef8;
  float in_stack_fffffffffffffefc;
  ImRect *in_stack_ffffffffffffff00;
  ImVec2 *in_stack_ffffffffffffff08;
  ImVec4 *in_stack_ffffffffffffff10;
  ImVec4 *col;
  ImRect *in_stack_ffffffffffffff18;
  ImVec2 *pIVar2;
  ImVec2 *in_stack_ffffffffffffff20;
  ImRect *in_stack_ffffffffffffff28;
  ImDrawList *in_stack_ffffffffffffff30;
  ImDrawList *this;
  ImU32 in_stack_ffffffffffffff40;
  ImU32 col_00;
  float in_stack_ffffffffffffff88;
  float in_stack_ffffffffffffff8c;
  ImVec2 *in_stack_ffffffffffffff90;
  ImVec2 in_stack_ffffffffffffff98;
  ImDrawList *in_stack_ffffffffffffffa0;
  ImVec2 local_58;
  ImVec2 local_50;
  undefined1 local_48 [16];
  ImGuiWindow *local_38;
  long local_30;
  ImTextureID local_20;
  ImVec2 *local_18;
  ImVec2 *local_8;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  local_38 = GetCurrentWindow();
  if ((local_38->SkipItems & 1U) == 0) {
    pIVar2 = &(local_38->DC).CursorPos;
    local_50 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                           (ImVec2 *)0x4dff8e);
    ImRect::ImRect((ImRect *)local_48,pIVar2,&local_50);
    if (0.0 < *(float *)(local_30 + 0xc)) {
      ImVec2::ImVec2(&local_58,2.0,2.0);
      operator+=((ImVec2 *)(local_48 + 8),&local_58);
    }
    ItemSize(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
    bVar1 = ItemAdd(in_stack_ffffffffffffff28,(ImGuiID)((ulong)in_stack_ffffffffffffff20 >> 0x20),
                    in_stack_ffffffffffffff18,
                    (ImGuiItemFlags)((ulong)in_stack_ffffffffffffff10 >> 0x20));
    if (bVar1) {
      if (*(float *)(local_30 + 0xc) <= 0.0) {
        col = (ImVec4 *)local_48;
        pIVar2 = (ImVec2 *)(local_48 + 8);
        GetColorU32(col);
        ImDrawList::AddImage
                  (in_stack_ffffffffffffff30,local_20,local_18,pIVar2,(ImVec2 *)col,local_8,
                   in_stack_ffffffffffffff40);
      }
      else {
        this = local_38->DrawList;
        GetColorU32(in_stack_ffffffffffffff10);
        ImDrawList::AddRect(in_stack_ffffffffffffffa0,(ImVec2 *)in_stack_ffffffffffffff98,
                            in_stack_ffffffffffffff90,(ImU32)in_stack_ffffffffffffff8c,
                            in_stack_ffffffffffffff88,(ImDrawFlags)((ulong)pIVar2 >> 0x20),
                            SUB84(pIVar2,0));
        pIVar2 = (ImVec2 *)&stack0xffffffffffffff98;
        ImVec2::ImVec2(pIVar2,1.0,1.0);
        col_00 = (ImU32)pIVar2;
        ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (ImVec2 *)0x4e00f1);
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff88,1.0,1.0);
        ::operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                    (ImVec2 *)0x4e0124);
        GetColorU32(in_stack_ffffffffffffff10);
        ImDrawList::AddImage
                  (this,in_stack_ffffffffffffff28,in_stack_ffffffffffffff20,
                   &in_stack_ffffffffffffff18->Min,(ImVec2 *)in_stack_ffffffffffffff10,
                   in_stack_ffffffffffffff08,col_00);
      }
    }
  }
  return;
}

Assistant:

void ImGui::Image(ImTextureID user_texture_id, const ImVec2& size, const ImVec2& uv0, const ImVec2& uv1, const ImVec4& tint_col, const ImVec4& border_col)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    if (border_col.w > 0.0f)
        bb.Max += ImVec2(2, 2);
    ItemSize(bb);
    if (!ItemAdd(bb, 0))
        return;

    if (border_col.w > 0.0f)
    {
        window->DrawList->AddRect(bb.Min, bb.Max, GetColorU32(border_col), 0.0f);
        window->DrawList->AddImage(user_texture_id, bb.Min + ImVec2(1, 1), bb.Max - ImVec2(1, 1), uv0, uv1, GetColorU32(tint_col));
    }
    else
    {
        window->DrawList->AddImage(user_texture_id, bb.Min, bb.Max, uv0, uv1, GetColorU32(tint_col));
    }
}